

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_maxelements
                 (lysp_ctx *ctx,lysp_stmt *stmt,uint32_t *max,uint16_t *flags,
                 lysp_ext_instance **exts)

{
  char cVar1;
  LY_ERR LVar2;
  int iVar3;
  size_t sVar4;
  ushort **ppuVar5;
  int *piVar6;
  ulonglong uVar7;
  char *pcVar8;
  char *format;
  lysp_stmt *stmt_00;
  ly_ctx *plVar9;
  char *ptr;
  char *local_38;
  
  if ((*flags >> 10 & 1) != 0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar9 = (ly_ctx *)0x0;
    }
    else {
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","max-elements");
    return LY_EVALID;
  }
  *flags = *flags | 0x400;
  LVar2 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  pcVar8 = stmt->arg;
  sVar4 = strlen(pcVar8);
  if ((((int)sVar4 == 0) || (cVar1 = *pcVar8, cVar1 == '0')) ||
     ((cVar1 != 'u' &&
      (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 8) == 0)))) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar9 = (ly_ctx *)0x0;
    }
    else {
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Invalid value \"%.*s\" of \"%s\".";
  }
  else {
    if (((sVar4 & 0xffffffff) == 9) && (iVar3 = strncmp(pcVar8,"unbounded",9), iVar3 == 0)) {
      uVar7 = 0;
LAB_0016d43d:
      *max = (uint32_t)uVar7;
      stmt_00 = stmt->child;
      if (stmt_00 == (lysp_stmt *)0x0) {
        return LY_SUCCESS;
      }
      while( true ) {
        if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) {
          if (ctx == (lysp_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar8 = lyplg_ext_stmt2str(stmt_00->kw);
          ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                  ,pcVar8,"max-elements");
          return LY_EVALID;
        }
        LVar2 = lysp_stmt_ext(ctx,stmt_00,LY_STMT_MAX_ELEMENTS,0,exts);
        if (LVar2 != LY_SUCCESS) break;
        stmt_00 = stmt_00->next;
        if (stmt_00 == (lysp_stmt *)0x0) {
          return LY_SUCCESS;
        }
      }
      return LVar2;
    }
    piVar6 = __errno_location();
    *piVar6 = 0;
    uVar7 = strtoull(pcVar8,&local_38,10);
    pcVar8 = stmt->arg;
    if ((long)local_38 - (long)pcVar8 == (long)(int)sVar4) {
      if (uVar7 >> 0x20 == 0 && *piVar6 != 0x22) goto LAB_0016d43d;
      if (ctx == (lysp_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Value \"%.*s\" is out of \"%s\" bounds.";
    }
    else {
      if (ctx == (lysp_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Invalid value \"%.*s\" of \"%s\".";
    }
  }
  ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,format,sVar4 & 0xffffffff,pcVar8,"max-elements");
  return LY_EVALID;
}

Assistant:

static LY_ERR
lysp_stmt_maxelements(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint32_t *max, uint16_t *flags,
        struct lysp_ext_instance **exts)
{
    int arg_len;
    char *ptr;
    unsigned long long num;

    if (*flags & LYS_SET_MAX) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "max-elements");
        return LY_EVALID;
    }
    *flags |= LYS_SET_MAX;

    /* get value */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);

    if (!arg_len || (stmt->arg[0] == '0') || ((stmt->arg[0] != 'u') && !isdigit(stmt->arg[0]))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "max-elements");
        return LY_EVALID;
    }

    if ((arg_len != ly_strlen_const("unbounded")) || strncmp(stmt->arg, "unbounded", arg_len)) {
        errno = 0;
        num = strtoull(stmt->arg, &ptr, LY_BASE_DEC);
        /* we have not parsed the whole argument */
        if (ptr - stmt->arg != arg_len) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "max-elements");
            return LY_EVALID;
        }
        if ((errno == ERANGE) || (num > UINT32_MAX)) {
            LOGVAL_PARSER(ctx, LY_VCODE_OOB, arg_len, stmt->arg, "max-elements");
            return LY_EVALID;
        }

        *max = num;
    } else {
        /* unbounded */
        *max = 0;
    }

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_MAX_ELEMENTS, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "max-elements");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}